

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer
          (COpenGLSLMaterialRenderer *this,COpenGLDriver *driver,s32 *outMaterialTypeNr,
          c8 *vertexShaderProgram,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,c8 *pixelShaderProgram,c8 *pixelShaderEntryPointName,
          E_PIXEL_SHADER_TYPE psCompileTarget,c8 *geometryShaderProgram,
          c8 *geometryShaderEntryPointName,E_GEOMETRY_SHADER_TYPE gsCompileTarget,
          E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,u32 verticesOut,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  long *plVar1;
  ulong uVar2;
  EVP_PKEY_CTX *in_RDX;
  undefined8 in_RSI;
  COpenGLSLMaterialRenderer *in_RDI;
  undefined4 in_stack_00000058;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI->field_0x58);
  IMaterialRenderer::IMaterialRenderer
            (&in_RDI->super_IMaterialRenderer,&PTR_construction_vtable_24__0043d088);
  IMaterialRendererServices::IMaterialRendererServices
            ((IMaterialRendererServices *)&(in_RDI->super_IMaterialRenderer).field_0x8);
  (in_RDI->super_IMaterialRenderer)._vptr_IMaterialRenderer = (_func_int **)0x43cf58;
  *(undefined8 *)&in_RDI->field_0x58 = 0x43d070;
  *(undefined8 *)&(in_RDI->super_IMaterialRenderer).field_0x8 = 0x43cff8;
  *(undefined8 *)&(in_RDI->super_IMaterialRenderer).field_0x10 = in_RSI;
  *(COpenGLSLMaterialRenderer **)&(in_RDI->super_IMaterialRenderer).field_0x18 = this;
  in_RDI->Alpha = false;
  in_RDI->Blending = false;
  in_RDI->AlphaTest = false;
  in_RDI->Program = 0;
  in_RDI->Program2 = 0;
  core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::array
            ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI->UserData = (s32)pixelShaderProgram;
  switch(in_stack_00000058) {
  case 1:
  case 3:
    in_RDI->Alpha = true;
    break;
  case 2:
    in_RDI->AlphaTest = true;
    break;
  case 4:
    in_RDI->Blending = true;
  }
  if (*(long *)&(in_RDI->super_IMaterialRenderer).field_0x18 != 0) {
    plVar1 = *(long **)&(in_RDI->super_IMaterialRenderer).field_0x18;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
  }
  plVar1 = *(long **)&(in_RDI->super_IMaterialRenderer).field_0x10;
  uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,0x12);
  if ((uVar2 & 1) != 0) {
    init(in_RDI,in_RDX);
  }
  return;
}

Assistant:

COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer(video::COpenGLDriver *driver,
		s32 &outMaterialTypeNr, const c8 *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const c8 *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const c8 *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData) :
		Driver(driver),
		CallBack(callback), Alpha(false), Blending(false), AlphaTest(false), Program(0), Program2(0), UserData(userData)
{
#ifdef _DEBUG
	setDebugName("COpenGLSLMaterialRenderer");
#endif

	switch (baseMaterial) {
	case EMT_TRANSPARENT_VERTEX_ALPHA:
	case EMT_TRANSPARENT_ALPHA_CHANNEL:
		Alpha = true;
		break;
	case EMT_ONETEXTURE_BLEND:
		Blending = true;
		break;
	case EMT_TRANSPARENT_ALPHA_CHANNEL_REF:
		AlphaTest = true;
		break;
	default:
		break;
	}

	if (CallBack)
		CallBack->grab();

	if (!Driver->queryFeature(EVDF_ARB_GLSL))
		return;

	init(outMaterialTypeNr, vertexShaderProgram, pixelShaderProgram, geometryShaderProgram);
}